

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_lpf_reinit__internal(ma_lpf_config *pConfig,void *pHeap,ma_lpf *pLPF,ma_bool32 isNew)

{
  double dVar1;
  uint local_118;
  uint local_114;
  ma_uint32 jlpf2;
  ma_uint32 jlpf1_1;
  size_t lpf2HeapSizeInBytes;
  undefined1 local_100 [16];
  double local_f0;
  double local_e8;
  double a;
  double q;
  ma_lpf2_config lpf2Config;
  size_t sStack_b0;
  ma_uint32 jlpf1;
  size_t lpf1HeapSizeInBytes;
  ma_lpf1_config lpf1Config;
  ma_lpf_heap_layout heapLayout;
  ma_uint32 ilpf2;
  ma_uint32 ilpf1;
  ma_uint32 lpf2Count;
  ma_uint32 lpf1Count;
  ma_result result;
  ma_bool32 isNew_local;
  ma_lpf *pLPF_local;
  void *pHeap_local;
  ma_lpf_config *pConfig_local;
  undefined8 local_38;
  double *local_30;
  double local_28;
  ma_lpf *local_20;
  double local_18;
  double local_10;
  
  if ((pLPF == (ma_lpf *)0x0) || (pConfig == (ma_lpf_config *)0x0)) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else if ((pConfig->format == ma_format_f32) || (pConfig->format == ma_format_s16)) {
    if ((pLPF->format == ma_format_unknown) || (pLPF->format == pConfig->format)) {
      if ((pLPF->channels == 0) || (pLPF->channels == pConfig->channels)) {
        if (pConfig->order < 9) {
          lpf1Count = isNew;
          _result = pLPF;
          pLPF_local = (ma_lpf *)pHeap;
          pHeap_local = pConfig;
          ma_lpf_calculate_sub_lpf_counts(pConfig->order,&ilpf1,&ilpf2);
          if ((lpf1Count == 0) && ((_result->lpf1Count != ilpf1 || (_result->lpf2Count != ilpf2))))
          {
            pConfig_local._4_4_ = MA_INVALID_OPERATION;
          }
          else {
            if (lpf1Count == 0) {
              local_30 = &lpf1Config.q;
              local_38 = 0x18;
              memset(local_30,0,0x18);
            }
            else {
              lpf2Count = ma_lpf_get_heap_layout
                                    ((ma_lpf_config *)pHeap_local,
                                     (ma_lpf_heap_layout *)&lpf1Config.q);
              if (lpf2Count != MA_SUCCESS) {
                return lpf2Count;
              }
              _result->_pHeap = pLPF_local;
              local_20 = pLPF_local;
              local_28 = lpf1Config.q;
              if (lpf1Config.q != 0.0) {
                memset(pLPF_local,0,(size_t)lpf1Config.q);
              }
              _result->pLPF1 = (ma_lpf1 *)((long)&pLPF_local->format + heapLayout.sizeInBytes);
              _result->pLPF2 = (ma_lpf2 *)((long)&pLPF_local->format + heapLayout.lpf1Offset);
            }
            for (heapLayout.lpf2Offset._4_4_ = 0; heapLayout.lpf2Offset._4_4_ < ilpf1;
                heapLayout.lpf2Offset._4_4_ = heapLayout.lpf2Offset._4_4_ + 1) {
              ma_lpf1_config_init((ma_lpf1_config *)&lpf1HeapSizeInBytes,*pHeap_local,
                                  *(ma_uint32 *)((long)pHeap_local + 4),
                                  *(ma_uint32 *)((long)pHeap_local + 8),
                                  *(double *)((long)pHeap_local + 0x10));
              if (lpf1Count == 0) {
                lpf2Count = ma_lpf1_reinit((ma_lpf1_config *)&lpf1HeapSizeInBytes,
                                           _result->pLPF1 + heapLayout.lpf2Offset._4_4_);
              }
              else {
                lpf2Count = ma_lpf1_get_heap_size
                                      ((ma_lpf1_config *)&lpf1HeapSizeInBytes,
                                       &stack0xffffffffffffff50);
                if (lpf2Count == MA_SUCCESS) {
                  lpf2Count = ma_lpf1_init_preallocated
                                        ((ma_lpf1_config *)&lpf1HeapSizeInBytes,
                                         (void *)((long)&pLPF_local->format +
                                                 heapLayout.sizeInBytes + (ulong)ilpf1 * 0x28 +
                                                 heapLayout.lpf2Offset._4_4_ * sStack_b0),
                                         _result->pLPF1 + heapLayout.lpf2Offset._4_4_);
                }
              }
              if (lpf2Count != 0) {
                for (lpf2Config.q._4_4_ = 0; lpf2Config.q._4_4_ < heapLayout.lpf2Offset._4_4_;
                    lpf2Config.q._4_4_ = lpf2Config.q._4_4_ + 1) {
                  ma_lpf1_uninit(_result->pLPF1 + lpf2Config.q._4_4_,(ma_allocation_callbacks *)0x0)
                  ;
                }
                return lpf2Count;
              }
            }
            for (heapLayout.lpf2Offset._0_4_ = 0; (uint)heapLayout.lpf2Offset < ilpf2;
                heapLayout.lpf2Offset._0_4_ = (uint)heapLayout.lpf2Offset + 1) {
              if (ilpf1 == 1) {
                local_e8 = (double)((uint)heapLayout.lpf2Offset + 1) *
                           (3.141592653589793 / (double)*(uint *)((long)pHeap_local + 0x18));
              }
              else {
                local_e8 = (double)((uint)heapLayout.lpf2Offset * 2 + 1) *
                           (3.141592653589793 /
                           (double)(uint)(*(int *)((long)pHeap_local + 0x18) * 2));
              }
              local_18 = local_e8;
              local_10 = 1.5707963267948966 - local_e8;
              dVar1 = sin(local_10);
              a = 1.0 / (dVar1 * 2.0);
              ma_lpf2_config_init((ma_lpf2_config *)&lpf2HeapSizeInBytes,*pHeap_local,
                                  *(ma_uint32 *)((long)pHeap_local + 4),
                                  *(ma_uint32 *)((long)pHeap_local + 8),
                                  *(double *)((long)pHeap_local + 0x10),a);
              q = (double)lpf2HeapSizeInBytes;
              lpf2Config.format = local_100._0_4_;
              lpf2Config.channels = local_100._4_4_;
              lpf2Config._8_8_ = local_100._8_8_;
              lpf2Config.cutoffFrequency = local_f0;
              if (lpf1Count == 0) {
                lpf2Count = ma_lpf2_reinit((ma_lpf2_config *)&q,
                                           _result->pLPF2 + (uint)heapLayout.lpf2Offset);
              }
              else {
                lpf2Count = ma_lpf2_get_heap_size((ma_lpf2_config *)&q,(size_t *)&jlpf2);
                if (lpf2Count == MA_SUCCESS) {
                  lpf2Count = ma_lpf2_init_preallocated
                                        ((ma_lpf2_config *)&q,
                                         (void *)((long)pLPF_local +
                                                 heapLayout.lpf1Offset + (ulong)ilpf2 * 0x40 +
                                                 (uint)heapLayout.lpf2Offset * _jlpf2),
                                         _result->pLPF2 + (uint)heapLayout.lpf2Offset);
                }
              }
              if (lpf2Count != 0) {
                for (local_114 = 0; local_114 < ilpf1; local_114 = local_114 + 1) {
                  ma_lpf1_uninit(_result->pLPF1 + local_114,(ma_allocation_callbacks *)0x0);
                }
                for (local_118 = 0; local_118 < (uint)heapLayout.lpf2Offset;
                    local_118 = local_118 + 1) {
                  ma_lpf2_uninit(_result->pLPF2 + local_118,(ma_allocation_callbacks *)0x0);
                }
                return lpf2Count;
              }
            }
            _result->lpf1Count = ilpf1;
            _result->lpf2Count = ilpf2;
            _result->format = *pHeap_local;
            _result->channels = *(ma_uint32 *)((long)pHeap_local + 4);
            _result->sampleRate = *(ma_uint32 *)((long)pHeap_local + 8);
            pConfig_local._4_4_ = MA_SUCCESS;
          }
        }
        else {
          pConfig_local._4_4_ = MA_INVALID_ARGS;
        }
      }
      else {
        pConfig_local._4_4_ = MA_INVALID_OPERATION;
      }
    }
    else {
      pConfig_local._4_4_ = MA_INVALID_OPERATION;
    }
  }
  else {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  return pConfig_local._4_4_;
}

Assistant:

static ma_result ma_lpf_reinit__internal(const ma_lpf_config* pConfig, void* pHeap, ma_lpf* pLPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 lpf1Count;
    ma_uint32 lpf2Count;
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;
    ma_lpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pLPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pLPF->format != ma_format_unknown && pLPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pLPF->channels != 0 && pLPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    ma_lpf_calculate_sub_lpf_counts(pConfig->order, &lpf1Count, &lpf2Count);

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pLPF->lpf1Count != lpf1Count || pLPF->lpf2Count != lpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_lpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pLPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pLPF->pLPF1 = (ma_lpf1*)ma_offset_ptr(pHeap, heapLayout.lpf1Offset);
        pLPF->pLPF2 = (ma_lpf2*)ma_offset_ptr(pHeap, heapLayout.lpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);    /* To silence a compiler warning. */
    }

    for (ilpf1 = 0; ilpf1 < lpf1Count; ilpf1 += 1) {
        ma_lpf1_config lpf1Config = ma_lpf1_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency);

        if (isNew) {
            size_t lpf1HeapSizeInBytes;

            result = ma_lpf1_get_heap_size(&lpf1Config, &lpf1HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf1_init_preallocated(&lpf1Config, ma_offset_ptr(pHeap, heapLayout.lpf1Offset + (sizeof(ma_lpf1) * lpf1Count) + (ilpf1 * lpf1HeapSizeInBytes)), &pLPF->pLPF1[ilpf1]);
            }
        } else {
            result = ma_lpf1_reinit(&lpf1Config, &pLPF->pLPF1[ilpf1]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;

            for (jlpf1 = 0; jlpf1 < ilpf1; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    for (ilpf2 = 0; ilpf2 < lpf2Count; ilpf2 += 1) {
        ma_lpf2_config lpf2Config;
        double q;
        double a;

        /* Tempting to use 0.707107, but won't result in a Butterworth filter if the order is > 2. */
        if (lpf1Count == 1) {
            a = (1 + ilpf2*1) * (MA_PI_D/(pConfig->order*1));   /* Odd order. */
        } else {
            a = (1 + ilpf2*2) * (MA_PI_D/(pConfig->order*2));   /* Even order. */
        }
        q = 1 / (2*ma_cosd(a));

        lpf2Config = ma_lpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t lpf2HeapSizeInBytes;

            result = ma_lpf2_get_heap_size(&lpf2Config, &lpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf2_init_preallocated(&lpf2Config, ma_offset_ptr(pHeap, heapLayout.lpf2Offset + (sizeof(ma_lpf2) * lpf2Count) + (ilpf2 * lpf2HeapSizeInBytes)), &pLPF->pLPF2[ilpf2]);
            }
        } else {
            result = ma_lpf2_reinit(&lpf2Config, &pLPF->pLPF2[ilpf2]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;
            ma_uint32 jlpf2;

            for (jlpf1 = 0; jlpf1 < lpf1Count; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            for (jlpf2 = 0; jlpf2 < ilpf2; jlpf2 += 1) {
                ma_lpf2_uninit(&pLPF->pLPF2[jlpf2], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    pLPF->lpf1Count  = lpf1Count;
    pLPF->lpf2Count  = lpf2Count;
    pLPF->format     = pConfig->format;
    pLPF->channels   = pConfig->channels;
    pLPF->sampleRate = pConfig->sampleRate;

    return MA_SUCCESS;
}